

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClockVarSymbol::serializeTo(ClockVarSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar2;
  ASTSerializer *in_stack_00000048;
  VariableSymbol *in_stack_00000050;
  ASTSerializer *in_stack_ffffffffffffff90;
  ASTSerializer *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  ASTSerializer *in_stack_ffffffffffffffc8;
  ClockingSkew *this_01;
  undefined4 local_20;
  undefined8 local_18;
  
  VariableSymbol::serializeTo(in_stack_00000050,in_stack_00000048);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff98);
  sVar2 = ast::toString(In);
  this_01 = (ClockingSkew *)sVar2._M_len;
  ASTSerializer::write(this_00,local_20,local_18,(size_t)this_01);
  bVar1 = ClockingSkew::hasValue((ClockingSkew *)(in_RDI + 0x160));
  if (bVar1) {
    in_stack_ffffffffffffff98 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    sVar2._M_str = (char *)this_00;
    sVar2._M_len = (size_t)in_stack_ffffffffffffff98;
    ASTSerializer::writeProperty(in_stack_ffffffffffffff90,sVar2);
    ASTSerializer::startObject((ASTSerializer *)0x10cbb75);
    ClockingSkew::serializeTo(this_01,in_stack_ffffffffffffffc8);
    ASTSerializer::endObject((ASTSerializer *)0x10cbb95);
  }
  bVar1 = ClockingSkew::hasValue((ClockingSkew *)(in_RDI + 0x170));
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff98);
    name._M_str = (char *)this_00;
    name._M_len = (size_t)in_stack_ffffffffffffff98;
    ASTSerializer::writeProperty(in_RSI,name);
    ASTSerializer::startObject((ASTSerializer *)0x10cbbe5);
    ClockingSkew::serializeTo(this_01,in_stack_ffffffffffffffc8);
    ASTSerializer::endObject((ASTSerializer *)0x10cbc05);
  }
  return;
}

Assistant:

void ClockVarSymbol::serializeTo(ASTSerializer& serializer) const {
    VariableSymbol::serializeTo(serializer);

    serializer.write("direction", toString(direction));

    if (inputSkew.hasValue()) {
        serializer.writeProperty("inputSkew");
        serializer.startObject();
        inputSkew.serializeTo(serializer);
        serializer.endObject();
    }

    if (outputSkew.hasValue()) {
        serializer.writeProperty("outputSkew");
        serializer.startObject();
        outputSkew.serializeTo(serializer);
        serializer.endObject();
    }
}